

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowpassSpeaker.hpp
# Opt level: O0

void __thiscall
Outputs::Speaker::
LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_Yamaha::OPL::OPLL>_>,_false>
::set_computed_output_rate
          (LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_Yamaha::OPL::OPLL>_>,_false>
           *this,float cycles_per_second,int buffer_size,bool param_3)

{
  float fVar1;
  size_type sVar2;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock_guard;
  bool param_3_local;
  int buffer_size_local;
  float cycles_per_second_local;
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_Yamaha::OPL::OPLL>_>,_false>
  *this_local;
  
  lock_guard._M_device._7_1_ = param_3;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->filter_parameters_mutex_);
  fVar1 = (this->filter_parameters_).output_cycles_per_second;
  if (((fVar1 != cycles_per_second) || (NAN(fVar1) || NAN(cycles_per_second))) ||
     (sVar2 = std::vector<short,_std::allocator<short>_>::size(&this->output_buffer_),
     (long)buffer_size != sVar2)) {
    (this->filter_parameters_).output_cycles_per_second = cycles_per_second;
    (this->filter_parameters_).parameters_are_dirty = true;
    std::vector<short,_std::allocator<short>_>::resize(&this->output_buffer_,(long)buffer_size);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return;
}

Assistant:

void set_computed_output_rate(float cycles_per_second, int buffer_size, bool) final {
			std::lock_guard lock_guard(filter_parameters_mutex_);
			if(filter_parameters_.output_cycles_per_second == cycles_per_second && size_t(buffer_size) == output_buffer_.size()) {
				return;
			}

			filter_parameters_.output_cycles_per_second = cycles_per_second;
			filter_parameters_.parameters_are_dirty = true;
			output_buffer_.resize(std::size_t(buffer_size) * (is_stereo + 1));
		}